

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_perfect_create(stb_perfect *p,uint *v,int n)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *p_00;
  void *p_01;
  void *p_02;
  ushort *__base;
  void *pvVar5;
  unsigned_long uVar6;
  stb_uint32 *psVar7;
  ushort *puVar8;
  long lVar9;
  ulong uVar10;
  stb_uint16 *psVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  size_t __nmemb;
  ulong uVar23;
  uint buffer5 [32];
  uint buffer3 [64];
  uint buffer4 [64];
  uint buffer2 [64];
  uint buffer1 [64];
  
  __nmemb = (size_t)n;
  iVar4 = (int)(__nmemb * 4);
  p_00 = stb__temp(buffer1,0x100,iVar4);
  p_01 = stb__temp(buffer2,0x100,iVar4);
  p_02 = stb__temp(buffer4,0x100,n * 2);
  if (0x8000 < n) {
    __assert_fail("n <= 32768",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xde7,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
  }
  iVar1 = stb_log2_ceil(n);
  uVar22 = 1 << ((byte)iVar1 & 0x1f);
  p->large_bmap = (stb_uint16 *)0x0;
  uVar2 = n;
  if (n < 1) {
    uVar2 = 0;
  }
  uVar23 = (ulong)uVar2;
  uVar14 = 8;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    iVar1 = (int)uVar14;
    __base = (ushort *)stb__temp(buffer3,0x100,iVar1 << 4);
    __size = (long)iVar1 * 2;
    pvVar5 = stb__temp(buffer5,0x80,(int)__size);
    uVar6 = stb__perfect_rand();
    p->addend = (stb_uint32)uVar6;
    uVar6 = stb__perfect_rand();
    uVar2 = (uint)uVar6 | 1;
    p->multiplicand = uVar2;
    p->table_mask = uVar22 - 1;
    p->b_mask = iVar1 - 1U;
    psVar7 = (stb_uint32 *)malloc((long)(int)uVar22 << 2);
    p->table = psVar7;
    uVar10 = 0;
    if (0 < iVar1) {
      uVar10 = uVar14;
    }
    puVar8 = __base + 2;
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      puVar8[-1] = (ushort)uVar13;
      puVar8[-2] = 0;
      *puVar8 = 0;
      puVar8 = puVar8 + 8;
    }
    for (uVar13 = 0; uVar23 != uVar13; uVar13 = uVar13 + 1) {
      uVar17 = v[uVar13];
      iVar16 = uVar17 * uVar2;
      *(ushort *)((long)p_01 + uVar13 * 2) =
           (ushort)(byte)((uint)iVar16 >> 0x18) + (short)(uVar17 >> 0x10) & (ushort)(iVar1 - 1U);
      *(ushort *)((long)p_00 + uVar13 * 2) =
           (ushort)((uVar17 >> 0x10) + iVar16 >> 0xc) & (ushort)(uVar22 - 1);
      __base[(ulong)*(ushort *)((long)p_01 + uVar13 * 2) * 8] =
           __base[(ulong)*(ushort *)((long)p_01 + uVar13 * 2) * 8] + 1;
    }
    qsort(__base,(long)iVar1,0x10,stb__slot_compare);
    puVar8 = __base;
    pvVar19 = p_02;
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      *(void **)(puVar8 + 4) = pvVar19;
      pvVar19 = (void *)((long)pvVar19 + (ulong)*puVar8 * 2);
      *puVar8 = 0;
      *(short *)((long)pvVar5 + (ulong)puVar8[1] * 2) = (short)uVar13;
      puVar8 = puVar8 + 8;
    }
    for (uVar13 = 0; uVar23 != uVar13; uVar13 = uVar13 + 1) {
      uVar20 = (ulong)*(ushort *)((long)pvVar5 + (ulong)*(ushort *)((long)p_01 + uVar13 * 2) * 2);
      lVar9 = *(long *)(__base + uVar20 * 8 + 4);
      uVar15 = __base[uVar20 * 8];
      __base[uVar20 * 8] = uVar15 + 1;
      *(short *)(lVar9 + (ulong)uVar15 * 2) = (short)uVar13;
    }
    stb_tempfree(buffer5,pvVar5);
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      uVar20 = 0;
      while (__base[uVar13 * 8] != uVar20) {
        lVar9 = uVar20 * 2;
        uVar20 = uVar20 + 1;
        if (*(ushort *)
             ((long)p_01 + (ulong)*(ushort *)(*(long *)(__base + uVar13 * 8 + 4) + lVar9) * 2) !=
            __base[uVar13 * 8 + 1]) {
          __assert_fail("bs[bcount[i].entries[j]] == bcount[i].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xe11,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
        }
      }
    }
    memset(p->table,0,(long)(int)uVar22 << 2);
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      uVar20 = (ulong)__base[uVar13 * 8];
      if (1 < uVar20) {
        psVar7 = p->table;
        lVar9 = *(long *)(__base + uVar13 * 8 + 4);
        bVar12 = false;
        for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
          uVar15 = *(ushort *)((long)p_00 + (ulong)*(ushort *)(lVar9 + uVar21 * 2) * 2);
          if (psVar7[uVar15] != 0) {
            bVar12 = true;
          }
          psVar7[uVar15] = 1;
        }
        for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
          psVar7[*(ushort *)((long)p_00 + (ulong)*(ushort *)(lVar9 + uVar21 * 2) * 2)] = 0;
        }
        if (bVar12) goto LAB_0014de5f;
      }
    }
    uVar2 = 0;
    if (0 < (int)uVar22) {
      uVar2 = uVar22;
    }
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      uVar20 = (ulong)__base[uVar13 * 8];
      if (uVar20 != 0) {
        uVar17 = 0;
LAB_0014ddcc:
        uVar18 = uVar2;
        if (uVar17 != uVar2) {
          uVar21 = 0;
          while( true ) {
            if (uVar20 == uVar21) goto LAB_0014de0a;
            if (p->table[(*(ushort *)
                           ((long)p_00 +
                           (ulong)*(ushort *)(*(long *)(__base + uVar13 * 8 + 4) + uVar21 * 2) * 2)
                         ^ uVar17) & p->table_mask] != 0) break;
            uVar21 = uVar21 + 1;
          }
          if (uVar20 != uVar21) goto code_r0x0014de06;
LAB_0014de0a:
          __base[uVar13 * 8 + 2] = (ushort)uVar17;
          lVar9 = *(long *)(__base + uVar13 * 8 + 4);
          psVar7 = p->table;
          for (uVar21 = 0; uVar18 = uVar17, uVar20 != uVar21; uVar21 = uVar21 + 1) {
            psVar7[(*(ushort *)((long)p_00 + (ulong)*(ushort *)(lVar9 + uVar21 * 2) * 2) ^ uVar17) &
                   p->table_mask] = 1;
          }
        }
        if (uVar18 != uVar22) goto LAB_0014de45;
        uVar10 = uVar13 & 0xffffffff;
        break;
      }
LAB_0014de45:
    }
    if ((int)uVar10 == iVar1) {
      if ((iVar1 < 0x11) && ((int)uVar22 < 0x101)) {
        p->large_bmap = (stb_uint16 *)0x0;
        uVar10 = 0;
        if (iVar1 < 1) {
          uVar14 = uVar10;
        }
        for (; uVar14 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
          p->small_bmap[*(ushort *)((long)__base + uVar10 + 2)] =
               *(stb_uint8 *)((long)__base + uVar10 + 4);
        }
      }
      else {
        psVar11 = (stb_uint16 *)malloc(__size);
        p->large_bmap = psVar11;
        uVar10 = 0;
        if (iVar1 < 1) {
          uVar14 = uVar10;
        }
        for (; uVar14 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
          psVar11[*(ushort *)((long)__base + uVar10 + 2)] =
               *(stb_uint16 *)((long)__base + uVar10 + 4);
        }
      }
      for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
        p->table[uVar14] = *v;
      }
      for (uVar14 = 0; uVar23 != uVar14; uVar14 = uVar14 + 1) {
        uVar15 = *(ushort *)((long)p_01 + uVar14 * 2);
        if (p->large_bmap == (stb_uint16 *)0x0) {
          uVar15 = (ushort)p->small_bmap[uVar15];
        }
        else {
          uVar15 = p->large_bmap[uVar15];
        }
        p->table[*(ushort *)((long)p_00 + uVar14 * 2) ^ uVar15] = v[uVar14];
      }
      uVar14 = 0;
      while (uVar23 != uVar14) {
        iVar4 = stb_perfect_hash(p,v[uVar14]);
        uVar14 = uVar14 + 1;
        if (iVar4 < 0) {
          __assert_fail("stb_perfect_hash(p, v[i]) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xe56,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
        }
      }
      stb_tempfree(buffer3,__base);
      goto LAB_0014e092;
    }
    psVar7 = p->table;
LAB_0014de5f:
    free(psVar7);
    p->table = (stb_uint32 *)0x0;
    stb_tempfree(buffer3,__base);
    uVar2 = uVar3 + 1;
    bVar12 = ((int)uVar22 < n * 4 && 6 < (int)uVar3) && (uVar2 & 3) == 0;
    uVar14 = (ulong)(uint)((iVar1 << (iVar1 < (int)uVar22 && 2 < (int)uVar3)) << bVar12);
    uVar22 = uVar22 << bVar12;
    if (uVar2 == 6) {
      pvVar5 = stb__temp(buffer3,0x100,iVar4);
      memcpy(pvVar5,v,__nmemb * 4);
      stb__intcmpoffset = 0;
      qsort(pvVar5,__nmemb,4,stb__intcmp);
      for (lVar9 = 1; lVar9 < (long)__nmemb; lVar9 = lVar9 + 1) {
        if (*(int *)((long)pvVar5 + lVar9 * 4) == *(int *)((long)pvVar5 + lVar9 * 4 + -4)) {
          uVar22 = 0;
        }
      }
      stb_tempfree(buffer3,pvVar5);
      uVar3 = 6;
      uVar2 = 6;
      if (uVar22 == 0) {
        uVar22 = 0;
LAB_0014e092:
        if (stb_perfect_hash_max_failures < (int)uVar3) {
          stb_perfect_hash_max_failures = uVar3;
        }
        stb_tempfree(buffer1,p_00);
        stb_tempfree(buffer2,p_01);
        stb_tempfree(buffer4,p_02);
        return uVar22;
      }
    }
  } while( true );
code_r0x0014de06:
  uVar17 = uVar17 + 1;
  goto LAB_0014ddcc;
}

Assistant:

int stb_perfect_create(stb_perfect *p, unsigned int *v, int n)
{
   unsigned int buffer1[64], buffer2[64], buffer3[64], buffer4[64], buffer5[32];
   unsigned short *as = (unsigned short *) stb_temp(buffer1, sizeof(*v)*n);
   unsigned short *bs = (unsigned short *) stb_temp(buffer2, sizeof(*v)*n);
   unsigned short *entries = (unsigned short *) stb_temp(buffer4, sizeof(*entries) * n);
   int size = 1 << stb_log2_ceil(n), bsize=8;
   int failure = 0,i,j,k;

   assert(n <= 32768);
   p->large_bmap = NULL;

   for(;;) {
      stb__slot *bcount = (stb__slot *) stb_temp(buffer3, sizeof(*bcount) * bsize);
      unsigned short *bloc = (unsigned short *) stb_temp(buffer5, sizeof(*bloc) * bsize);
      unsigned short *e;
      int bad=0;

      p->addend = stb__perfect_rand();
      p->multiplicand = stb__perfect_rand() | 1;
      p->table_mask = size-1;
      p->b_mask = bsize-1;
      p->table = (stb_uint32 *) malloc(size * sizeof(*p->table));

      for (i=0; i < bsize; ++i) {
         bcount[i].b     = i;
         bcount[i].count = 0;
         bcount[i].map   = 0;
      }
      for (i=0; i < n; ++i) {
         stb__perfect_prehash(p, v[i], as+i, bs+i);
         ++bcount[bs[i]].count;
      }
      qsort(bcount, bsize, sizeof(*bcount), stb__slot_compare);
      e = entries; // now setup up their entries index
      for (i=0; i < bsize; ++i) {
         bcount[i].entries = e;
         e += bcount[i].count;
         bcount[i].count = 0;
         bloc[bcount[i].b] = i;
      }
      // now fill them out
      for (i=0; i < n; ++i) {
         int b = bs[i];
         int w = bloc[b];
         bcount[w].entries[bcount[w].count++] = i;
      }
      stb_tempfree(buffer5,bloc);
      // verify
      for (i=0; i < bsize; ++i)
         for (j=0; j < bcount[i].count; ++j)
            assert(bs[bcount[i].entries[j]] == bcount[i].b);
      memset(p->table, 0, size*sizeof(*p->table));

      // check if any b has duplicate a
      for (i=0; i < bsize; ++i) {
         if (bcount[i].count > 1) {
            for (j=0; j < bcount[i].count; ++j) {
               if (p->table[as[bcount[i].entries[j]]])
                  bad = 1;
               p->table[as[bcount[i].entries[j]]] = 1;
            }
            for (j=0; j < bcount[i].count; ++j) {
               p->table[as[bcount[i].entries[j]]] = 0;
            }
            if (bad) break;
         }
      }

      if (!bad) {
         // go through the bs and populate the table, first fit
         for (i=0; i < bsize; ++i) {
            if (bcount[i].count) {
               // go through the candidate table[b] values
               for (j=0; j < size; ++j) {
                  // go through the a values and see if they fit
                  for (k=0; k < bcount[i].count; ++k) {
                     int a = as[bcount[i].entries[k]];
                     if (p->table[(a^j)&p->table_mask]) {
                        break; // fails
                     }
                  }
                  // if succeeded, accept
                  if (k == bcount[i].count) {
                     bcount[i].map = j;
                     for (k=0; k < bcount[i].count; ++k) {
                        int a = as[bcount[i].entries[k]];
                        p->table[(a^j)&p->table_mask] = 1;
                     }
                     break;
                  }
               }
               if (j == size)
                  break; // no match for i'th entry, so break out in failure
            }
         }
         if (i == bsize) {
            // success... fill out map
            if (bsize <= 16 && size <= 256) {
               p->large_bmap = NULL;
               for (i=0; i < bsize; ++i)
                  p->small_bmap[bcount[i].b] = (stb_uint8) bcount[i].map;
            } else {
               p->large_bmap = (unsigned short *) malloc(sizeof(*p->large_bmap) * bsize);
               for (i=0; i < bsize; ++i)
                  p->large_bmap[bcount[i].b] = bcount[i].map;
            }

            // initialize table to v[0], so empty slots will fail
            for (i=0; i < size; ++i)
               p->table[i] = v[0];

            for (i=0; i < n; ++i)
               if (p->large_bmap)
                  p->table[as[i] ^ p->large_bmap[bs[i]]] = v[i];
               else
                  p->table[as[i] ^ p->small_bmap[bs[i]]] = v[i];

            // and now validate that none of them collided
            for (i=0; i < n; ++i)
               assert(stb_perfect_hash(p, v[i]) >= 0);

            stb_tempfree(buffer3, bcount);
            break;
         }
      }
      free(p->table);
      p->table = NULL;
      stb_tempfree(buffer3, bcount);

      ++failure;
      if (failure >= 4 && bsize < size) bsize *= 2;
      if (failure >= 8 && (failure & 3) == 0 && size < 4*n) {
         size *= 2;
         bsize *= 2;
      }
      if (failure == 6) {
         // make sure the input data is unique, so we don't infinite loop
         unsigned int *data = (unsigned int *) stb_temp(buffer3, n * sizeof(*data));
         memcpy(data, v, sizeof(*data) * n);
         qsort(data, n, sizeof(*data), stb_intcmp(0));
         for (i=1; i < n; ++i) {
            if (data[i] == data[i-1])
               size = 0; // size is return value, so 0 it
         }
         stb_tempfree(buffer3, data);
         if (!size) break;
      }
   }

   if (failure > stb_perfect_hash_max_failures)
      stb_perfect_hash_max_failures = failure;

   stb_tempfree(buffer1, as);
   stb_tempfree(buffer2, bs);
   stb_tempfree(buffer4, entries);

   return size;
}